

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O1

void zng_tr_flush_bits(deflate_state *s)

{
  uint uVar1;
  int iVar2;
  sbyte sVar3;
  int iVar4;
  
  if (s->bi_valid < 0x30) {
    if (s->bi_valid < 0x20) goto LAB_00136976;
    *(int *)(s->pending_buf + s->pending) = (int)s->bi_buf;
    iVar2 = -0x20;
    sVar3 = 0x20;
    iVar4 = 4;
  }
  else {
    *(int *)(s->pending_buf + s->pending) = (int)s->bi_buf;
    uVar1 = s->pending + 4;
    s->pending = uVar1;
    *(undefined2 *)(s->pending_buf + uVar1) = *(undefined2 *)((long)&s->bi_buf + 4);
    iVar2 = -0x30;
    sVar3 = 0x30;
    iVar4 = 2;
  }
  s->pending = s->pending + iVar4;
  s->bi_buf = s->bi_buf >> sVar3;
  s->bi_valid = s->bi_valid + iVar2;
LAB_00136976:
  if (0xf < s->bi_valid) {
    *(short *)(s->pending_buf + s->pending) = (short)s->bi_buf;
    s->pending = s->pending + 2;
    s->bi_buf = s->bi_buf >> 0x10;
    s->bi_valid = s->bi_valid + -0x10;
  }
  if (7 < s->bi_valid) {
    uVar1 = s->pending;
    s->pending = uVar1 + 1;
    s->pending_buf[uVar1] = (uchar)s->bi_buf;
    s->bi_buf = s->bi_buf >> 8;
    s->bi_valid = s->bi_valid + -8;
  }
  return;
}

Assistant:

void Z_INTERNAL zng_tr_flush_bits(deflate_state *s) {
    if (s->bi_valid >= 48) {
        put_uint32(s, (uint32_t)s->bi_buf);
        put_short(s, (uint16_t)(s->bi_buf >> 32));
        s->bi_buf >>= 48;
        s->bi_valid -= 48;
    } else if (s->bi_valid >= 32) {
        put_uint32(s, (uint32_t)s->bi_buf);
        s->bi_buf >>= 32;
        s->bi_valid -= 32;
    }
    if (s->bi_valid >= 16) {
        put_short(s, (uint16_t)s->bi_buf);
        s->bi_buf >>= 16;
        s->bi_valid -= 16;
    }
    if (s->bi_valid >= 8) {
        put_byte(s, s->bi_buf);
        s->bi_buf >>= 8;
        s->bi_valid -= 8;
    }
}